

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool cmSystemTools::CheckRPath(string *file,string *newRPath)

{
  bool bVar1;
  byte bVar2;
  char *fname;
  ulong uVar3;
  size_type sVar4;
  string_view local_88;
  string_view local_78;
  undefined4 local_64;
  StringEntry *local_60;
  StringEntry *se;
  undefined1 local_48 [8];
  cmELF elf;
  string *newRPath_local;
  string *file_local;
  
  elf.ErrorMessage.field_2._8_8_ = newRPath;
  fname = (char *)std::__cxx11::string::c_str();
  cmELF::cmELF((cmELF *)local_48,fname);
  bVar1 = cmELF::operator_cast_to_bool((cmELF *)local_48);
  if (bVar1) {
    local_60 = cmELF::GetRPath((cmELF *)local_48);
    if (local_60 == (StringEntry *)0x0) {
      local_60 = cmELF::GetRunPath((cmELF *)local_48);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      bVar1 = false;
      if (local_60 != (StringEntry *)0x0) {
        local_78 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
        local_88 = (string_view)
                   std::__cxx11::string::operator_cast_to_basic_string_view
                             ((string *)elf.ErrorMessage.field_2._8_8_);
        sVar4 = cmSystemToolsFindRPath(&local_78,&local_88);
        bVar1 = sVar4 != 0xffffffffffffffff;
      }
      if (bVar1) {
        file_local._7_1_ = true;
        goto LAB_0011fd0f;
      }
    }
    else if (local_60 == (StringEntry *)0x0) {
      file_local._7_1_ = true;
      goto LAB_0011fd0f;
    }
    file_local._7_1_ = false;
  }
  else {
    bVar2 = std::__cxx11::string::empty();
    file_local._7_1_ = (bool)(bVar2 & 1);
  }
LAB_0011fd0f:
  local_64 = 1;
  cmELF::~cmELF((cmELF *)local_48);
  return file_local._7_1_;
}

Assistant:

bool cmSystemTools::CheckRPath(std::string const& file,
                               std::string const& newRPath)
{
  // Parse the ELF binary.
  cmELF elf(file.c_str());
  if (elf) {
    // Get the RPATH or RUNPATH entry from it.
    cmELF::StringEntry const* se = elf.GetRPath();
    if (!se) {
      se = elf.GetRunPath();
    }

    // Make sure the current rpath contains the new rpath.
    if (newRPath.empty()) {
      if (!se) {
        return true;
      }
    } else {
      if (se &&
          cmSystemToolsFindRPath(se->Value, newRPath) != std::string::npos) {
        return true;
      }
    }
    return false;
  }
#if defined(CMake_USE_XCOFF_PARSER)
  // Parse the XCOFF binary.
  cmXCOFF xcoff(file.c_str());
  if (xcoff) {
    if (cm::optional<cm::string_view> libPath = xcoff.GetLibPath()) {
      if (cmSystemToolsFindRPath(*libPath, newRPath) != std::string::npos) {
        return true;
      }
    }
    return false;
  }
#endif
  // The file format is not recognized.  Assume it has no RPATH.
  // Therefore we succeed if the new rpath is empty anyway.
  return newRPath.empty();
}